

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O1

int ebur128_loudness_momentary(ebur128_state *st,double *out)

{
  int iVar1;
  ulong frames_per_block;
  double dVar2;
  double energy;
  double local_20;
  
  frames_per_block = st->d->samples_in_100ms << 2;
  iVar1 = 2;
  if (frames_per_block <= st->d->audio_data_frames) {
    ebur128_calc_gating_block(st,frames_per_block,&local_20);
    if (local_20 <= 0.0) {
      dVar2 = -INFINITY;
    }
    else {
      dVar2 = log(local_20);
      dVar2 = (dVar2 / 2.302585092994046) * 10.0 + -0.691;
    }
    *out = dVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ebur128_loudness_momentary(ebur128_state* st, double* out) {
  double energy;
  int error;

  error = ebur128_energy_in_interval(st, st->d->samples_in_100ms * 4, &energy);
  if (error) {
    return error;
  }

  if (energy <= 0.0) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  *out = ebur128_energy_to_loudness(energy);
  return EBUR128_SUCCESS;
}